

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_setting_nds_with_Tenors_Test::TestBody
          (SubjectFactoryTest_test_setting_nds_with_Tenors_Test *this)

{
  string *psVar1;
  Tenor *pTVar2;
  undefined8 *puVar3;
  char *message;
  allocator<char> local_12b;
  allocator<char> local_12a;
  allocator<char> local_129;
  AssertionResult gtest_ar;
  AssertHelper local_118 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  undefined8 local_80;
  SubjectFactory subject_factory;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70 [8];
  string local_30 [32];
  
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(&subject_factory,USER_INFO);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_80 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Nds();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"CSFX",&local_129);
  psVar1 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Swap::LiquidityProvider(local_30);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"USDCNY",&local_12a);
  psVar1 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Swap::CurrencyPair(psVar1);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"USD",&local_12b);
  bidfx_public_api::price::subject::SubjectFactory::FX::Swap::Currency(psVar1);
  pTVar2 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearQuantity
                              (1000000.0);
  bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearTenor(pTVar2);
  pTVar2 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarQuantity
                              (850000.0);
  puVar3 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarTenor(pTVar2);
  (**(code **)*puVar3)(&local_f8,puVar3);
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,
             "\"AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett\""
             ,
             "subject_factory.Fx().Stream().Nds() .LiquidityProvider(\"CSFX\") .CurrencyPair(\"USDCNY\") .Currency(\"USD\") .NearQuantity(1000000) .NearTenor(Tenor::IN_1_MONTH) .FarQuantity(850000) .FarTenor(Tenor::IN_3_MONTHS) .CreateSubject() .ToString().c_str()"
             ,
             "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett"
             ,(char *)local_118[0].data_);
  std::__cxx11::string::~string((string *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
            ((MandatoryFieldsSubjectCreator *)local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_factory_test.cpp"
               ,0x254,message);
    testing::internal::AssertHelper::operator=(local_118,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper(local_118);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_nds_with_Tenors)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett",
            subject_factory.Fx().Stream().Nds()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("USDCNY")
                    .Currency("USD")
                    .NearQuantity(1000000)
                    .NearTenor(Tenor::IN_1_MONTH)
                    .FarQuantity(850000)
                    .FarTenor(Tenor::IN_3_MONTHS)
                    .CreateSubject()
                    .ToString().c_str());
}